

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_string_extend(yaml_char_t **start,yaml_char_t **pointer,yaml_char_t **end)

{
  yaml_char_t *pyVar1;
  yaml_char_t *new_start;
  yaml_char_t **end_local;
  yaml_char_t **pointer_local;
  yaml_char_t **start_local;
  
  pyVar1 = (yaml_char_t *)yaml_realloc(*start,((long)*end - (long)*start) * 2);
  if (pyVar1 != (yaml_char_t *)0x0) {
    memset(pyVar1 + ((long)*end - (long)*start),0,(long)*end - (long)*start);
    *pointer = pyVar1 + ((long)*pointer - (long)*start);
    *end = pyVar1 + ((long)*end - (long)*start) * 2;
    *start = pyVar1;
  }
  start_local._4_4_ = (uint)(pyVar1 != (yaml_char_t *)0x0);
  return start_local._4_4_;
}

Assistant:

YAML_DECLARE(int)
yaml_string_extend(yaml_char_t **start,
        yaml_char_t **pointer, yaml_char_t **end)
{
    yaml_char_t *new_start = (yaml_char_t *)yaml_realloc((void*)*start, (*end - *start)*2);

    if (!new_start) return 0;

    memset(new_start + (*end - *start), 0, *end - *start);

    *pointer = new_start + (*pointer - *start);
    *end = new_start + (*end - *start)*2;
    *start = new_start;

    return 1;
}